

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testPreviewImage.cpp
# Opt level: O2

void testPreviewImage(string *tempDir)

{
  float *pfVar1;
  long lVar2;
  long lVar3;
  float fVar4;
  Rgba *pRVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  ostream *poVar9;
  Box<Imath_3_2::Vec2<int>_> *this;
  long lVar10;
  Header *pHVar11;
  long lVar12;
  Box<Imath_3_2::Vec2<int>_> *src;
  int x;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  char *__assertion;
  int iVar20;
  int y;
  PreviewImage preview1;
  long local_4e0;
  Array<Imf_3_4::Rgba> pixels1;
  RgbaInputFile file1;
  string filename2;
  string filename1;
  RgbaOutputFile file2;
  Rgba *local_438;
  char local_430 [16];
  byte abStack_420 [488];
  Header header;
  char local_228 [16];
  uint auStack_218 [122];
  
  std::operator+(&filename1,tempDir,"imf_preview1.exr");
  std::operator+(&filename2,tempDir,"imf_preview2.exr");
  poVar9 = std::operator<<((ostream *)&std::cout,"Testing preview image attribute");
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"reading file ");
  poVar9 = std::operator<<(poVar9,
                           "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/comp_piz.exr"
                          );
  std::endl<char,std::char_traits<char>>(poVar9);
  iVar8 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile
            (&file1,
             "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/comp_piz.exr"
             ,iVar8);
  Imf_3_4::RgbaInputFile::header();
  cVar6 = Imf_3_4::Header::hasPreviewImage();
  if (cVar6 == '\0') {
    this = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::RgbaInputFile::dataWindow();
    iVar8 = (this->min).x;
    lVar16 = (long)iVar8;
    iVar20 = ((this->max).x - iVar8) + 1;
    iVar8 = (this->min).y;
    Imf_3_4::Array<Imf_3_4::Rgba>::Array(&pixels1,(long)((((this->max).y - iVar8) + 1) * iVar20));
    lVar10 = (long)(iVar8 * iVar20);
    Imf_3_4::RgbaInputFile::setFrameBuffer
              ((Rgba *)&file1,(ulong)(pixels1._data + (-lVar16 - lVar10)),1);
    Imf_3_4::RgbaInputFile::readPixels((int)&file1,(this->min).y);
    poVar9 = std::operator<<((ostream *)&std::cout,"generating preview image");
    std::endl<char,std::char_traits<char>>(poVar9);
    Imf_3_4::PreviewImage::PreviewImage(&preview1,0x80,0x40,(PreviewRgba *)0x0);
    iVar8 = -0x80000000;
    for (iVar20 = 0; iVar20 != 0x40; iVar20 = iVar20 + 1) {
      iVar14 = iVar8;
      for (iVar13 = 0; iVar13 != 0x80; iVar13 = iVar13 + 1) {
        *(int *)(local_4e0 + (ulong)(uint)(_preview1 * iVar20 + iVar13) * 4) = iVar14;
        iVar14 = iVar14 + 0x10002;
      }
      iVar8 = iVar8 + 0x10400;
    }
    poVar9 = std::operator<<((ostream *)&std::cout,"writing file ");
    poVar9 = std::operator<<(poVar9,filename1._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>(poVar9);
    pHVar11 = (Header *)Imf_3_4::RgbaInputFile::header();
    Imf_3_4::Header::Header(&header,pHVar11);
    Imf_3_4::Header::setPreviewImage((PreviewImage *)&header);
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaOutputFile::RgbaOutputFile
              (&file2,filename1._M_dataplus._M_p,&header,WRITE_RGBA,iVar8);
    Imf_3_4::RgbaOutputFile::setFrameBuffer
              ((Rgba *)&file2,(ulong)(pixels1._data + (-lVar16 - lVar10)),1);
    for (iVar8 = (this->min).y; iVar8 <= (this->max).y; iVar8 = iVar8 + 1) {
      Imf_3_4::RgbaOutputFile::writePixels((int)&file2);
    }
    Imf_3_4::RgbaOutputFile::~RgbaOutputFile(&file2);
    Imf_3_4::Header::~Header(&header);
    poVar9 = std::operator<<((ostream *)&std::cout,"reading file ");
    poVar9 = std::operator<<(poVar9,filename1._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>(poVar9);
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&header,filename1._M_dataplus._M_p,iVar8)
    ;
    Imf_3_4::RgbaInputFile::header();
    cVar6 = Imf_3_4::Header::hasPreviewImage();
    if (cVar6 == '\0') {
      __assertion = "file2.header ().hasPreviewImage ()";
      uVar17 = 99;
    }
    else {
      Imf_3_4::RgbaInputFile::header();
      lVar12 = Imf_3_4::Header::previewImage();
      lVar12 = *(long *)(lVar12 + 8);
      lVar15 = 0;
      do {
        if (lVar15 == 0x2000) {
          src = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::RgbaInputFile::dataWindow();
          bVar7 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(this,src);
          if (bVar7) {
            iVar8 = (this->min).x;
            iVar14 = ((this->max).x - iVar8) + 1;
            iVar20 = (this->min).y;
            uVar17 = (((this->max).y - iVar20) + 1) * iVar14;
            Imf_3_4::Array<Imf_3_4::Rgba>::Array((Array<Imf_3_4::Rgba> *)&file2,(long)(int)uVar17);
            Imf_3_4::RgbaInputFile::setFrameBuffer
                      ((Rgba *)&header,(ulong)(local_438 + (-(long)iVar8 - (long)(iVar20 * iVar14)))
                       ,1);
            Imf_3_4::RgbaInputFile::readPixels((int)&header,(this->min).y);
            uVar19 = 0;
            uVar18 = (ulong)uVar17;
            if ((int)uVar17 < 1) {
              uVar18 = uVar19;
            }
            goto LAB_0017998c;
          }
          __assertion = "dw == file2.dataWindow ()";
          uVar17 = 0x6f;
          goto LAB_00179d8a;
        }
        if (*(char *)(local_4e0 + lVar15 * 4) != *(char *)(lVar12 + lVar15 * 4)) {
          __assertion = "preview1.pixels ()[i].r == preview2.pixels ()[i].r";
          uVar17 = 0x69;
          goto LAB_00179d8a;
        }
        if (*(char *)(local_4e0 + 1 + lVar15 * 4) != *(char *)(lVar12 + 1 + lVar15 * 4)) {
          __assertion = "preview1.pixels ()[i].g == preview2.pixels ()[i].g";
          uVar17 = 0x6a;
          goto LAB_00179d8a;
        }
        if (*(char *)(local_4e0 + 2 + lVar15 * 4) != *(char *)(lVar12 + 2 + lVar15 * 4)) {
          __assertion = "preview1.pixels ()[i].b == preview2.pixels ()[i].b";
          uVar17 = 0x6b;
          goto LAB_00179d8a;
        }
        lVar2 = lVar15 * 4;
        lVar3 = lVar15 * 4;
        lVar15 = lVar15 + 1;
      } while (*(char *)(local_4e0 + 3 + lVar2) == *(char *)(lVar12 + 3 + lVar3));
      __assertion = "preview1.pixels ()[i].a == preview2.pixels ()[i].a";
      uVar17 = 0x6c;
    }
  }
  else {
    __assertion = "!file1.header ().hasPreviewImage ()";
    uVar17 = 0x39;
  }
  goto LAB_00179d8a;
  while( true ) {
    fVar4 = *(float *)(_imath_half_to_float_table + (ulong)pixels1._data[uVar19].g._h * 4);
    pfVar1 = (float *)(_imath_half_to_float_table + (ulong)local_438[uVar19].g._h * 4);
    if ((fVar4 != *pfVar1) || (NAN(fVar4) || NAN(*pfVar1))) {
      __assertion = "pixels1[i].g == pixels2[i].g";
      uVar17 = 0x7d;
      goto LAB_00179d8a;
    }
    fVar4 = *(float *)(_imath_half_to_float_table + (ulong)pixels1._data[uVar19].b._h * 4);
    pfVar1 = (float *)(_imath_half_to_float_table + (ulong)local_438[uVar19].b._h * 4);
    if ((fVar4 != *pfVar1) || (NAN(fVar4) || NAN(*pfVar1))) {
      __assertion = "pixels1[i].b == pixels2[i].b";
      uVar17 = 0x7e;
      goto LAB_00179d8a;
    }
    fVar4 = *(float *)(_imath_half_to_float_table + (ulong)pixels1._data[uVar19].a._h * 4);
    pRVar5 = local_438 + uVar19;
    uVar19 = uVar19 + 1;
    pfVar1 = (float *)(_imath_half_to_float_table + (ulong)(pRVar5->a)._h * 4);
    if ((fVar4 != *pfVar1) || (NAN(fVar4) || NAN(*pfVar1))) break;
LAB_0017998c:
    if (uVar18 == uVar19) {
      Imf_3_4::Array<Imf_3_4::Rgba>::~Array((Array<Imf_3_4::Rgba> *)&file2);
      Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&header);
      poVar9 = std::operator<<((ostream *)&std::cout,"writing file ");
      poVar9 = std::operator<<(poVar9,filename2._M_dataplus._M_p);
      std::endl<char,std::char_traits<char>>(poVar9);
      pHVar11 = (Header *)Imf_3_4::RgbaInputFile::header();
      Imf_3_4::Header::Header(&header,pHVar11);
      Imf_3_4::PreviewImage::PreviewImage((PreviewImage *)&file2,0x80,0x40,(PreviewRgba *)0x0);
      Imf_3_4::Header::setPreviewImage((PreviewImage *)&header);
      Imf_3_4::PreviewImage::~PreviewImage((PreviewImage *)&file2);
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::RgbaOutputFile::RgbaOutputFile
                (&file2,filename2._M_dataplus._M_p,&header,WRITE_RGBA,iVar8);
      Imf_3_4::RgbaOutputFile::setFrameBuffer
                ((Rgba *)&file2,(ulong)(pixels1._data + (-lVar16 - lVar10)),1);
      for (iVar8 = (this->min).y; iVar8 <= (this->max).y; iVar8 = iVar8 + 1) {
        Imf_3_4::RgbaOutputFile::writePixels((int)(PreviewRgba *)&file2);
        if (iVar8 == ((this->max).y + (this->min).y) / 2) {
          Imf_3_4::RgbaOutputFile::updatePreviewImage((PreviewRgba *)&file2);
        }
      }
      Imf_3_4::RgbaOutputFile::~RgbaOutputFile(&file2);
      Imf_3_4::Header::~Header(&header);
      poVar9 = std::operator<<((ostream *)&std::cout,"comparing files ");
      poVar9 = std::operator<<(poVar9,filename1._M_dataplus._M_p);
      poVar9 = std::operator<<(poVar9," and ");
      poVar9 = std::operator<<(poVar9,filename2._M_dataplus._M_p);
      std::endl<char,std::char_traits<char>>(poVar9);
      std::ifstream::ifstream(&header);
      std::ifstream::ifstream(&file2);
      std::filebuf::open(local_228,(_Ios_Openmode)filename1._M_dataplus._M_p);
      std::filebuf::open(local_430,(_Ios_Openmode)filename2._M_dataplus._M_p);
      while( true ) {
        iVar8 = std::istream::get();
        iVar20 = std::istream::get();
        uVar17 = *(uint *)((long)auStack_218 + *(long *)((long)_header + -0x18));
        if ((uVar17 & 2) != 0) {
          std::ifstream::~ifstream(&file2);
          std::ifstream::~ifstream(&header);
          remove(filename1._M_dataplus._M_p);
          remove(filename2._M_dataplus._M_p);
          Imf_3_4::PreviewImage::~PreviewImage(&preview1);
          Imf_3_4::Array<Imf_3_4::Rgba>::~Array(&pixels1);
          Imf_3_4::RgbaInputFile::~RgbaInputFile(&file1);
          poVar9 = std::operator<<((ostream *)&std::cout,"ok\n");
          std::endl<char,std::char_traits<char>>(poVar9);
          std::__cxx11::string::~string((string *)&filename2);
          std::__cxx11::string::~string((string *)&filename1);
          return;
        }
        if (iVar8 != iVar20) break;
        if (((uVar17 & 5) != 0) || ((abStack_420[*(long *)((long)_file2 + -0x18)] & 5) != 0)) {
          __assert_fail("!!file2 && !!file3",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                        ,0xa6,
                        "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                       );
        }
      }
      __assert_fail("c2 == c3",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                    ,0xa5,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    fVar4 = *(float *)(_imath_half_to_float_table + (ulong)pixels1._data[uVar19].r._h * 4);
    pfVar1 = (float *)(_imath_half_to_float_table + (ulong)local_438[uVar19].r._h * 4);
    if ((fVar4 != *pfVar1) || (NAN(fVar4) || NAN(*pfVar1))) {
      __assertion = "pixels1[i].r == pixels2[i].r";
      uVar17 = 0x7c;
      goto LAB_00179d8a;
    }
  }
  __assertion = "pixels1[i].a == pixels2[i].a";
  uVar17 = 0x7f;
LAB_00179d8a:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                ,uVar17,
                "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
               );
}

Assistant:

void
testPreviewImage (const std::string& tempDir)
{
    std::string filename1 = tempDir + "imf_preview1.exr";
    std::string filename2 = tempDir + "imf_preview2.exr";

    try
    {
        cout << "Testing preview image attribute" << endl;

        readWriteFiles (
            ILM_IMF_TEST_IMAGEDIR "comp_piz.exr",
            filename1.c_str (),
            filename2.c_str ());

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}